

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

int jsonnet::internal::countNewlines(FodderElement *elem)

{
  int iVar1;
  size_type sVar2;
  ostream *this;
  int *in_RDI;
  int local_4;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    local_4 = 1;
  }
  else if (iVar1 == 1) {
    local_4 = 0;
  }
  else {
    if (iVar1 != 2) {
      this = std::operator<<((ostream *)&std::cerr,"Unknown FodderElement kind");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      abort();
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 4));
    local_4 = (int)sVar2 + in_RDI[1];
  }
  return local_4;
}

Assistant:

static inline int countNewlines(const FodderElement &elem)
{
    switch (elem.kind) {
        case FodderElement::INTERSTITIAL: return 0;
        case FodderElement::LINE_END: return 1;
        case FodderElement::PARAGRAPH: return elem.comment.size() + elem.blanks;
    }
    std::cerr << "Unknown FodderElement kind" << std::endl;
    abort();
}